

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetPchHeader
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  cmMakefile *pcVar1;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar2;
  uint uVar3;
  Encoding encoding;
  pointer ppVar4;
  string *psVar5;
  cmGlobalGenerator *pcVar6;
  ulong uVar7;
  mapped_type *args_1;
  reference filename_00;
  char *pcVar8;
  ostream *poVar9;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_char_*>_>::value,_pair<iterator,_bool>_>
  _Var10;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_940;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *header_bt;
  const_iterator __end3;
  const_iterator __begin3;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  cmGeneratedFileStream file;
  string firstHeaderOnDisk;
  string local_600;
  cmValue local_5e0;
  cmValue pchEpilogue;
  string local_5d0;
  cmValue local_5b0;
  cmValue pchPrologue;
  cmAlphaNum local_578;
  undefined1 local_548 [8];
  string filename_tmp;
  cmAlphaNum local_4f8;
  byte local_4c2;
  allocator<char> local_4c1;
  string local_4c0;
  cmAlphaNum local_4a0;
  cmAlphaNum local_470;
  string local_440;
  cmAlphaNum local_420;
  cmAlphaNum local_3f0;
  string local_3c0;
  cmAlphaNum local_3a0;
  cmAlphaNum local_370;
  string local_340;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_31a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_319;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_318;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_290;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  iterator local_210;
  size_type local_208;
  undefined1 local_200 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  languageToExtension;
  cmAlphaNum local_1a0;
  string local_170;
  string *local_150;
  string *filename;
  undefined1 local_140 [8];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  headers;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  local_d8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_char_*>_>::value,_pair<iterator,_bool>_>
  inserted;
  string local_98;
  cmValue local_78;
  cmValue pchReuseFrom;
  cmGeneratorTarget *generatorTarget;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *arch_local;
  string *language_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_30 = arch;
  arch_local = language;
  language_local = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  bVar2 = std::operator!=(language,"C");
  if ((((bVar2) && (bVar2 = std::operator!=(arch_local,"CXX"), bVar2)) &&
      (bVar2 = std::operator!=(arch_local,"OBJC"), bVar2)) &&
     (bVar2 = std::operator!=(arch_local,"OBJCXX"), bVar2)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"DISABLE_PRECOMPILE_HEADERS",&local_51);
    bVar2 = GetPropertyAsBool(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    if (bVar2) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      pchReuseFrom.Value = (string *)this;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"PRECOMPILE_HEADERS_REUSE_FROM",
                 (allocator<char> *)&inserted.field_0xf);
      local_78 = GetProperty(this,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)&inserted.field_0xf);
      std::operator+(&local_118,arch_local,language_local);
      std::operator+(&local_f8,&local_118,local_30);
      std::make_pair<std::__cxx11::string,char_const(&)[1]>
                (&local_d8,&local_f8,(char (*) [1])0xd96e47);
      _Var10 = std::
               map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               ::insert<std::pair<std::__cxx11::string,char_const*>>
                         ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                           *)&this->PchHeaders,&local_d8);
      headers.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_Var10.first._M_node;
      inserted.first._M_node._0_1_ = _Var10.second;
      local_b0._M_node =
           (_Base_ptr)
           headers.
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
      ::~pair(&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      if (((byte)inserted.first._M_node & 1) != 0) {
        GetPrecompileHeaders
                  ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_140,this,language_local,arch_local);
        bVar2 = std::
                vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::empty((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_140);
        if ((!bVar2) || (bVar2 = cmValue::operator_cast_to_bool(&local_78), bVar2)) {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&local_b0);
          local_150 = &ppVar4->second;
          bVar2 = cmValue::operator_cast_to_bool(&local_78);
          if (bVar2) {
            pcVar6 = GetGlobalGenerator(this);
            psVar5 = cmValue::operator*[abi_cxx11_(&local_78);
            pchReuseFrom.Value = (string *)cmGlobalGenerator::FindGeneratorTarget(pcVar6,psVar5);
          }
          psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                             ((cmLocalGenerator *)
                              ((pchReuseFrom.Value)->field_2)._M_allocated_capacity);
          cmAlphaNum::cmAlphaNum(&local_1a0,psVar5);
          cmAlphaNum::cmAlphaNum
                    ((cmAlphaNum *)
                     &languageToExtension._M_t._M_impl.super__Rb_tree_header._M_node_count,"/");
          cmStrCat<>(&local_170,&local_1a0,
                     (cmAlphaNum *)
                     &languageToExtension._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::__cxx11::string::operator=((string *)local_150,(string *)&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          local_318 = &local_310;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
                    (local_318,(char (*) [2])0xd3d47b,(char (*) [3])0xd6363f);
          local_318 = &local_2d0;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[4],_const_char_(&)[5],_true>
                    (local_318,(char (*) [4])0xd2aba5,(char (*) [5])0xd63649);
          local_318 = &local_290;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[5],_const_char_(&)[8],_true>
                    (local_318,(char (*) [5])"OBJC",(char (*) [8])".objc.h");
          local_318 = &local_250;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[7],_const_char_(&)[12],_true>
                    (local_318,(char (*) [7])"OBJCXX",(char (*) [12])".objcxx.hxx");
          local_210 = &local_310;
          local_208 = 4;
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::allocator(&local_31a);
          __l._M_len = local_208;
          __l._M_array = local_210;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_200,__l,&local_319,&local_31a);
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~allocator(&local_31a);
          local_940 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_210;
          do {
            local_940 = local_940 + -1;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(local_940);
          } while (local_940 != &local_310);
          cmAlphaNum::cmAlphaNum(&local_370,local_150);
          cmAlphaNum::cmAlphaNum(&local_3a0,"CMakeFiles/");
          psVar5 = GetName_abi_cxx11_(pchReuseFrom.Value);
          cmStrCat<std::__cxx11::string,char[5]>
                    (&local_340,&local_370,&local_3a0,psVar5,(char (*) [5])0xd68de2);
          std::__cxx11::string::operator=((string *)local_150,(string *)&local_340);
          std::__cxx11::string::~string((string *)&local_340);
          pcVar6 = GetGlobalGenerator(this);
          uVar3 = (*pcVar6->_vptr_cmGlobalGenerator[0x26])();
          if ((uVar3 & 1) != 0) {
            cmAlphaNum::cmAlphaNum(&local_3f0,local_150);
            cmAlphaNum::cmAlphaNum(&local_420,"/");
            cmStrCat<std::__cxx11::string>(&local_3c0,&local_3f0,&local_420,language_local);
            std::__cxx11::string::operator=((string *)local_150,(string *)&local_3c0);
            std::__cxx11::string::~string((string *)&local_3c0);
          }
          cmAlphaNum::cmAlphaNum(&local_470,local_150);
          cmAlphaNum::cmAlphaNum(&local_4a0,"/cmake_pch");
          uVar7 = std::__cxx11::string::empty();
          local_4c2 = 0;
          if ((uVar7 & 1) == 0) {
            cmAlphaNum::cmAlphaNum(&local_4f8,"_");
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&filename_tmp.field_2 + 8),local_30);
            cmStrCat<>(&local_4c0,&local_4f8,(cmAlphaNum *)((long)&filename_tmp.field_2 + 8));
          }
          else {
            std::allocator<char>::allocator();
            local_4c2 = 1;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"",&local_4c1);
          }
          args_1 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_200,arch_local);
          cmStrCat<std::__cxx11::string,std::__cxx11::string>
                    (&local_440,&local_470,&local_4a0,&local_4c0,args_1);
          std::__cxx11::string::operator=((string *)local_150,(string *)&local_440);
          std::__cxx11::string::~string((string *)&local_440);
          std::__cxx11::string::~string((string *)&local_4c0);
          if ((local_4c2 & 1) != 0) {
            std::allocator<char>::~allocator(&local_4c1);
          }
          cmAlphaNum::cmAlphaNum(&local_578,local_150);
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)&pchPrologue,".tmp");
          cmStrCat<>((string *)local_548,&local_578,(cmAlphaNum *)&pchPrologue);
          bVar2 = cmValue::operator_cast_to_bool(&local_78);
          if (!bVar2) {
            pcVar1 = this->Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_5d0,"CMAKE_PCH_PROLOGUE",
                       (allocator<char> *)((long)&pchEpilogue.Value + 7));
            local_5b0 = cmMakefile::GetDefinition(pcVar1,&local_5d0);
            std::__cxx11::string::~string((string *)&local_5d0);
            std::allocator<char>::~allocator((allocator<char> *)((long)&pchEpilogue.Value + 7));
            pcVar1 = this->Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_600,"CMAKE_PCH_EPILOGUE",
                       (allocator<char> *)(firstHeaderOnDisk.field_2._M_local_buf + 0xf));
            local_5e0 = cmMakefile::GetDefinition(pcVar1,&local_600);
            std::__cxx11::string::~string((string *)&local_600);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(firstHeaderOnDisk.field_2._M_local_buf + 0xf));
            std::__cxx11::string::string((string *)&file.field_0x260);
            pcVar6 = GetGlobalGenerator(this);
            encoding = (*pcVar6->_vptr_cmGlobalGenerator[5])();
            cmGeneratedFileStream::cmGeneratedFileStream
                      ((cmGeneratedFileStream *)&__range3,(string *)local_548,false,encoding);
            std::operator<<((ostream *)&__range3,"/* generated by CMake */\n\n");
            bVar2 = cmValue::operator_cast_to_bool(&local_5b0);
            if (bVar2) {
              psVar5 = cmValue::operator*[abi_cxx11_(&local_5b0);
              poVar9 = std::operator<<((ostream *)&__range3,(string *)psVar5);
              std::operator<<(poVar9,"\n");
            }
            pcVar6 = GetGlobalGenerator(this);
            uVar3 = (*pcVar6->_vptr_cmGlobalGenerator[0x27])();
            if ((uVar3 & 1) != 0) {
              std::operator<<((ostream *)&__range3,"#ifndef CMAKE_SKIP_PRECOMPILE_HEADERS\n");
            }
            bVar2 = std::operator==(arch_local,"CXX");
            if (bVar2) {
              pcVar6 = GetGlobalGenerator(this);
              uVar3 = (*pcVar6->_vptr_cmGlobalGenerator[0x27])();
              if ((uVar3 & 1) == 0) {
                std::operator<<((ostream *)&__range3,"#ifdef __cplusplus\n");
              }
            }
            __end3 = std::
                     vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::begin((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_140);
            header_bt = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)std::
                           vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::end((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_140);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                               *)&header_bt), bVar2) {
              filename_00 = __gnu_cxx::
                            __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ::operator*(&__end3);
              uVar7 = std::__cxx11::string::empty();
              if ((uVar7 & 1) == 0) {
                pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)filename_00);
                if ((*pcVar8 == '<') ||
                   (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)filename_00),
                   *pcVar8 == '\"')) {
                  poVar9 = std::operator<<((ostream *)&__range3,"#include ");
                  poVar9 = std::operator<<(poVar9,(string *)filename_00);
                  std::operator<<(poVar9,"\n");
                }
                else {
                  poVar9 = std::operator<<((ostream *)&__range3,"#include \"");
                  poVar9 = std::operator<<(poVar9,(string *)filename_00);
                  std::operator<<(poVar9,"\"\n");
                }
                bVar2 = cmsys::SystemTools::FileExists(&filename_00->Value);
                if ((bVar2) && (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) != 0)) {
                  std::__cxx11::string::operator=((string *)&file.field_0x260,(string *)filename_00)
                  ;
                }
              }
              __gnu_cxx::
              __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator++(&__end3);
            }
            bVar2 = std::operator==(arch_local,"CXX");
            if (bVar2) {
              pcVar6 = GetGlobalGenerator(this);
              uVar3 = (*pcVar6->_vptr_cmGlobalGenerator[0x27])();
              if ((uVar3 & 1) == 0) {
                std::operator<<((ostream *)&__range3,"#endif // __cplusplus\n");
              }
            }
            pcVar6 = GetGlobalGenerator(this);
            uVar3 = (*pcVar6->_vptr_cmGlobalGenerator[0x27])();
            if ((uVar3 & 1) != 0) {
              std::operator<<((ostream *)&__range3,"#endif // CMAKE_SKIP_PRECOMPILE_HEADERS\n");
            }
            bVar2 = cmValue::operator_cast_to_bool(&local_5e0);
            if (bVar2) {
              psVar5 = cmValue::operator*[abi_cxx11_(&local_5e0);
              poVar9 = std::operator<<((ostream *)&__range3,(string *)psVar5);
              std::operator<<(poVar9,"\n");
            }
            cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&__range3);
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              cmFileTimes::Copy((string *)&file.field_0x260,(string *)local_548);
            }
            cmSystemTools::MoveFileIfDifferent((string *)local_548,local_150);
            std::__cxx11::string::~string((string *)&file.field_0x260);
          }
          std::__cxx11::string::~string((string *)local_548);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_200);
          filename._4_4_ = 0;
        }
        else {
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          filename._4_4_ = 1;
        }
        std::
        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_140);
        if (filename._4_4_ != 0) {
          return __return_storage_ptr__;
        }
      }
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_b0);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar4->second);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchHeader(const std::string& config,
                                            const std::string& language,
                                            const std::string& arch) const
{
  if (language != "C" && language != "CXX" && language != "OBJC" &&
      language != "OBJCXX") {
    return std::string();
  }

  if (this->GetPropertyAsBool("DISABLE_PRECOMPILE_HEADERS")) {
    return std::string();
  }
  const cmGeneratorTarget* generatorTarget = this;
  cmValue pchReuseFrom =
    generatorTarget->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");

  const auto inserted =
    this->PchHeaders.insert(std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    const std::vector<BT<std::string>> headers =
      this->GetPrecompileHeaders(config, language);
    if (headers.empty() && !pchReuseFrom) {
      return std::string();
    }
    std::string& filename = inserted.first->second;

    if (pchReuseFrom) {
      generatorTarget =
        this->GetGlobalGenerator()->FindGeneratorTarget(*pchReuseFrom);
    }

    filename = cmStrCat(
      generatorTarget->LocalGenerator->GetCurrentBinaryDirectory(), "/");

    const std::map<std::string, std::string> languageToExtension = {
      { "C", ".h" },
      { "CXX", ".hxx" },
      { "OBJC", ".objc.h" },
      { "OBJCXX", ".objcxx.hxx" }
    };

    filename =
      cmStrCat(filename, "CMakeFiles/", generatorTarget->GetName(), ".dir");

    if (this->GetGlobalGenerator()->IsMultiConfig()) {
      filename = cmStrCat(filename, "/", config);
    }

    filename =
      cmStrCat(filename, "/cmake_pch", arch.empty() ? "" : cmStrCat("_", arch),
               languageToExtension.at(language));

    const std::string filename_tmp = cmStrCat(filename, ".tmp");
    if (!pchReuseFrom) {
      cmValue pchPrologue =
        this->Makefile->GetDefinition("CMAKE_PCH_PROLOGUE");
      cmValue pchEpilogue =
        this->Makefile->GetDefinition("CMAKE_PCH_EPILOGUE");

      std::string firstHeaderOnDisk;
      {
        cmGeneratedFileStream file(
          filename_tmp, false,
          this->GetGlobalGenerator()->GetMakefileEncoding());
        file << "/* generated by CMake */\n\n";
        if (pchPrologue) {
          file << *pchPrologue << "\n";
        }
        if (this->GetGlobalGenerator()->IsXcode()) {
          file << "#ifndef CMAKE_SKIP_PRECOMPILE_HEADERS\n";
        }
        if (language == "CXX" && !this->GetGlobalGenerator()->IsXcode()) {
          file << "#ifdef __cplusplus\n";
        }
        for (auto const& header_bt : headers) {
          if (header_bt.Value.empty()) {
            continue;
          }
          if (header_bt.Value[0] == '<' || header_bt.Value[0] == '\"') {
            file << "#include " << header_bt.Value << "\n";
          } else {
            file << "#include \"" << header_bt.Value << "\"\n";
          }

          if (cmSystemTools::FileExists(header_bt.Value) &&
              firstHeaderOnDisk.empty()) {
            firstHeaderOnDisk = header_bt.Value;
          }
        }
        if (language == "CXX" && !this->GetGlobalGenerator()->IsXcode()) {
          file << "#endif // __cplusplus\n";
        }
        if (this->GetGlobalGenerator()->IsXcode()) {
          file << "#endif // CMAKE_SKIP_PRECOMPILE_HEADERS\n";
        }
        if (pchEpilogue) {
          file << *pchEpilogue << "\n";
        }
      }

      if (!firstHeaderOnDisk.empty()) {
        cmFileTimes::Copy(firstHeaderOnDisk, filename_tmp);
      }

      cmSystemTools::MoveFileIfDifferent(filename_tmp, filename);
    }
  }
  return inserted.first->second;
}